

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BilateralNormalFilteringForMeshDenoising.cpp
# Opt level: O2

void __thiscall
BilateralNormalFilteringForMeshDenoising::updateFilteredNormalsLocalScheme
          (BilateralNormalFilteringForMeshDenoising *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *filtered_normals)

{
  pointer *this_00;
  double dVar1;
  double dVar2;
  ParameterSet *pPVar3;
  pointer pVVar4;
  bool bVar5;
  size_type __new_size;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  FaceIter FVar14;
  undefined1 auStack_188 [8];
  vector<double,_std::allocator<double>_> face_area;
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> face_neighbor;
  double multiple_sigma_c;
  double sigma_s;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  PolyConnectivity *local_100;
  undefined1 auStack_f8 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> face_centroid
  ;
  undefined1 local_d8 [8];
  FaceIter f_it;
  undefined1 auStack_a8 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  previous_normals;
  int local_84;
  int local_80;
  int face_neighbor_index;
  int normal_iteration_number;
  double dStack_70;
  double local_68;
  undefined1 auStack_58 [8];
  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
  all_face_neighbor;
  
  __new_size = (**(code **)(*(long *)&(mesh->super_Mesh).
                                      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                      .
                                      super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           + 0x28))(mesh);
  std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::resize
            (filtered_normals,__new_size);
  pPVar3 = (this->super_MeshDenoisingBase).parameter_set_;
  std::__cxx11::string::string((string *)auStack_58,"Face Neighbor",(allocator *)auStack_a8);
  bVar5 = ParameterSet::getValue(pPVar3,(string *)auStack_58,&local_84);
  std::__cxx11::string::~string((string *)auStack_58);
  if (bVar5) {
    pPVar3 = (this->super_MeshDenoisingBase).parameter_set_;
    std::__cxx11::string::string((string *)auStack_58,"Multiple(* sigma_c)",(allocator *)auStack_a8)
    ;
    bVar5 = ParameterSet::getValue
                      (pPVar3,(string *)auStack_58,
                       (double *)
                       &face_neighbor.
                        super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)auStack_58);
    if (bVar5) {
      pPVar3 = (this->super_MeshDenoisingBase).parameter_set_;
      std::__cxx11::string::string
                ((string *)auStack_58,"Normal Iteration Num.",(allocator *)auStack_a8);
      bVar5 = ParameterSet::getValue(pPVar3,(string *)auStack_58,&local_80);
      std::__cxx11::string::~string((string *)auStack_58);
      if (bVar5) {
        pPVar3 = (this->super_MeshDenoisingBase).parameter_set_;
        std::__cxx11::string::string((string *)auStack_58,"sigma_s",(allocator *)auStack_a8);
        bVar5 = ParameterSet::getValue(pPVar3,(string *)auStack_58,&multiple_sigma_c);
        std::__cxx11::string::~string((string *)auStack_58);
        if (bVar5) {
          auStack_58 = (undefined1  [8])0x0;
          all_face_neighbor.
          super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          all_face_neighbor.
          super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          MeshDenoisingBase::getAllFaceNeighbor
                    (&this->super_MeshDenoisingBase,mesh,
                     (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                      *)auStack_58,(uint)(local_84 != 0),false);
          auStack_a8 = (undefined1  [8])0x0;
          previous_normals.
          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          previous_normals.
          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          MeshDenoisingBase::getFaceNormal
                    (&this->super_MeshDenoisingBase,mesh,
                     (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                      *)auStack_a8);
          auStack_188 = (undefined1  [8])0x0;
          face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          MeshDenoisingBase::getFaceArea
                    (&this->super_MeshDenoisingBase,mesh,
                     (vector<double,_std::allocator<double>_> *)auStack_188);
          auStack_f8 = (undefined1  [8])0x0;
          face_centroid.
          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          face_centroid.
          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          MeshDenoisingBase::getFaceCentroid
                    (&this->super_MeshDenoisingBase,mesh,
                     (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                      *)auStack_f8);
          local_108 = getSigmaC(this,mesh,
                                (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                 *)auStack_f8,
                                (double)face_neighbor.
                                        super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_108 = local_108 * local_108;
          this_00 = &face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          local_100 = (PolyConnectivity *)mesh;
          for (iVar9 = 0; iVar9 < local_80; iVar9 = iVar9 + 1) {
            _local_d8 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)mesh);
            face_neighbor_index = iVar9;
            while( true ) {
              iVar9 = face_neighbor_index;
              FVar14 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
              if (f_it.mesh_._0_4_ == (BaseHandle)FVar14.hnd_.super_BaseHandle.idx_ &&
                  local_d8 == (undefined1  [8])FVar14.mesh_) break;
              lVar6 = (long)(int)f_it.mesh_._0_4_;
              local_138 = (((pointer)((long)auStack_a8 + lVar6 * 0x18))->
                          super_VectorDataT<double,_3>).values_[0];
              local_130 = (((pointer)((long)auStack_a8 + lVar6 * 0x18))->
                          super_VectorDataT<double,_3>).values_[1];
              local_128 = (((pointer)((long)auStack_a8 + lVar6 * 0x18))->
                          super_VectorDataT<double,_3>).values_[2];
              local_120 = (((pointer)((long)auStack_f8 + lVar6 * 0x18))->
                          super_VectorDataT<double,_3>).values_[0];
              local_118 = (((pointer)((long)auStack_f8 + lVar6 * 0x18))->
                          super_VectorDataT<double,_3>).values_[1];
              local_110 = (((pointer)((long)auStack_f8 + lVar6 * 0x18))->
                          super_VectorDataT<double,_3>).values_[2];
              std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::vector
                        ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                         this_00,(vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                  *)((long)auStack_58 + lVar6 * 0x18));
              uVar7 = (ulong)((long)face_neighbor.
                                    super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                    ._M_impl.super__Vector_impl_data._M_start -
                             (long)face_area.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage) >> 2;
              uVar8 = uVar7 & 0xffffffff;
              if ((int)uVar7 < 1) {
                uVar8 = 0;
              }
              _normal_iteration_number = 0.0;
              dStack_70 = 0.0;
              local_68 = 0.0;
              dVar10 = 0.0;
              for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
                iVar9 = *(int *)((long)face_area.super__Vector_base<double,_std::allocator<double>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                uVar7 * 4);
                dVar1 = (((pointer)((long)auStack_a8 + (long)iVar9 * 0x18))->
                        super_VectorDataT<double,_3>).values_[0];
                dVar2 = (((pointer)((long)auStack_a8 + (long)iVar9 * 0x18))->
                        super_VectorDataT<double,_3>).values_[1];
                f_it._8_8_ = (((pointer)((long)auStack_a8 + (long)iVar9 * 0x18))->
                             super_VectorDataT<double,_3>).values_[2];
                dVar11 = local_120 -
                         (((pointer)((long)auStack_f8 + (long)iVar9 * 0x18))->
                         super_VectorDataT<double,_3>).values_[0];
                dVar12 = local_118 -
                         (((pointer)((long)auStack_f8 + (long)iVar9 * 0x18))->
                         super_VectorDataT<double,_3>).values_[1];
                dVar13 = local_110 -
                         (((pointer)((long)auStack_f8 + (long)iVar9 * 0x18))->
                         super_VectorDataT<double,_3>).values_[2];
                dVar11 = SQRT(dVar13 * dVar13 + dVar11 * dVar11 + dVar12 * dVar12);
                sigma_s = dVar10;
                local_140 = exp((dVar11 * -0.5 * dVar11) / local_108);
                dVar10 = local_138 - dVar1;
                dVar11 = local_130 - dVar2;
                dVar10 = SQRT((local_128 - (double)f_it._8_8_) * (local_128 - (double)f_it._8_8_) +
                              dVar10 * dVar10 + dVar11 * dVar11);
                dVar11 = exp((dVar10 * -0.5 * dVar10) / (multiple_sigma_c * multiple_sigma_c));
                dVar11 = local_140 * *(double *)((long)auStack_188 + (long)iVar9 * 8) * dVar11;
                dVar10 = sigma_s + dVar11;
                _normal_iteration_number = dVar1 * dVar11 + _normal_iteration_number;
                dStack_70 = dVar2 * dVar11 + dStack_70;
                local_68 = dVar11 * (double)f_it._8_8_ + local_68;
              }
              _normal_iteration_number = _normal_iteration_number / dVar10;
              dStack_70 = dStack_70 / dVar10;
              local_68 = local_68 / dVar10;
              OpenMesh::VectorT<double,_3>::normalize
                        ((VectorT<double,_3> *)&normal_iteration_number);
              pVVar4 = (filtered_normals->
                       super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pVVar4[lVar6].super_VectorDataT<double,_3>.values_[2] = local_68;
              pVVar4 = pVVar4 + lVar6;
              (pVVar4->super_VectorDataT<double,_3>).values_[0] = _normal_iteration_number;
              (pVVar4->super_VectorDataT<double,_3>).values_[1] = dStack_70;
              std::_Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::
              ~_Vector_base((_Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                             *)this_00);
              OpenMesh::Iterators::
              GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
              ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                            *)local_d8,0);
              mesh = (TriMesh *)local_100;
            }
            std::
            vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
            operator=((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                       *)auStack_a8,filtered_normals);
          }
          std::
          _Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          ::~_Vector_base((_Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                           *)auStack_f8);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    ((_Vector_base<double,_std::allocator<double>_> *)auStack_188);
          std::
          _Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          ::~_Vector_base((_Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                           *)auStack_a8);
          std::
          vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
          ::~vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                     *)auStack_58);
        }
      }
    }
  }
  return;
}

Assistant:

void BilateralNormalFilteringForMeshDenoising::updateFilteredNormalsLocalScheme(TriMesh &mesh, std::vector<TriMesh::Normal> &filtered_normals)
{
    filtered_normals.resize(mesh.n_faces());

    // get parameter for local scheme normal update
    int face_neighbor_index;
    if(!parameter_set_->getValue(string("Face Neighbor"), face_neighbor_index))
        return;
    double multiple_sigma_c;
    if(!parameter_set_->getValue(string("Multiple(* sigma_c)"), multiple_sigma_c))
        return;
    int normal_iteration_number;
    if(!parameter_set_->getValue(string("Normal Iteration Num."), normal_iteration_number))
        return;
    double sigma_s;
    if(!parameter_set_->getValue(string("sigma_s"), sigma_s))
        return;

    FaceNeighborType face_neighbor_type = (face_neighbor_index == 0) ? kVertexBased : kEdgeBased;

    std::vector< std::vector<TriMesh::FaceHandle> > all_face_neighbor;
    getAllFaceNeighbor(mesh, all_face_neighbor, face_neighbor_type, false);
    std::vector<TriMesh::Normal> previous_normals;
    getFaceNormal(mesh, previous_normals);
    std::vector<double> face_area;
    getFaceArea(mesh, face_area);
    std::vector<TriMesh::Point> face_centroid;
    getFaceCentroid(mesh, face_centroid);

    double sigma_c = getSigmaC(mesh, face_centroid, multiple_sigma_c);

    for(int iter = 0; iter < normal_iteration_number; iter++)
    {
        for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
        {
            int index_i = f_it->idx();
            TriMesh::Normal ni = previous_normals[index_i];
            TriMesh::Point ci = face_centroid[index_i];
            std::vector<TriMesh::FaceHandle> face_neighbor = all_face_neighbor[index_i];
            int size = (int)face_neighbor.size();
            TriMesh::Normal temp_normal(0.0, 0.0, 0.0);
            double weight_sum = 0.0;
            for(int i = 0; i < size; i++)
            {
                int index_j = face_neighbor[i].idx();
                TriMesh::Normal nj = previous_normals[index_j];
                TriMesh::Point cj = face_centroid[index_j];

                double spatial_distance = (ci - cj).length();
                double spatial_weight = std::exp( -0.5 * spatial_distance * spatial_distance / (sigma_c * sigma_c) );
                double range_distance = (ni - nj).length();
                double range_weight = std::exp( -0.5 * range_distance * range_distance / (sigma_s * sigma_s) );

                double weight = face_area[index_j] * spatial_weight * range_weight;
                weight_sum += weight;
                temp_normal += nj * weight;
            }
            temp_normal /= weight_sum;
            temp_normal.normalize();
            filtered_normals[index_i] = temp_normal;
        }
        previous_normals = filtered_normals;
    }
}